

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketabstraction_p.h
# Opt level: O2

QString * QSocketAbstraction::socketPeerName(QString *__return_storage_ptr__,QIODevice *device)

{
  QIODevice *in_RCX;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getPeerName;
  QSocketAbstraction local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = (QSocketAbstraction)0xaa;
  visit<QSocketAbstraction::socketPeerName(QIODevice*)::_lambda(auto:1*)_1_&>
            (__return_storage_ptr__,&local_11,(anon_class_1_0_00000001 *)device,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QString socketPeerName(QIODevice *device)
{
    auto getPeerName = [](auto *s) {
        using T = std::remove_pointer_t<decltype(s)>;
        if constexpr (std::is_same_v<T, QAbstractSocket>) {
            return s->peerName();
#if QT_CONFIG(localserver)
        } else if constexpr (std::is_same_v<T, QLocalSocket>) {
            return s->serverName();
#endif
        }
        Q_UNREACHABLE();
    };
    return visit(getPeerName, device);
}